

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

void __thiscall TypeChecker::visit(TypeChecker *this,FunctionCallNode *node)

{
  string *psVar1;
  reference_wrapper<Symbol> *this_00;
  Symbol *pSVar2;
  _Optional_base<TypeName,_true,_true> this_01;
  FunctionCallNode *in_RSI;
  long in_RDI;
  FunctionAnalyser analyser;
  Symbol *symbol;
  string name;
  FunctionAnalyser *in_stack_ffffffffffffff40;
  undefined1 local_88 [28];
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  SymbolTable *in_stack_ffffffffffffffa0;
  string local_30 [48];
  
  psVar1 = FunctionCallNode::getName_abi_cxx11_(in_RSI);
  std::__cxx11::string::string(local_30,(string *)psVar1);
  SymbolTable::lookup(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94)
  ;
  this_00 = std::optional<std::reference_wrapper<Symbol>_>::value
                      ((optional<std::reference_wrapper<Symbol>_> *)in_stack_ffffffffffffff40);
  pSVar2 = std::reference_wrapper<Symbol>::get(this_00);
  FunctionAnalyser::FunctionAnalyser(in_stack_ffffffffffffff40);
  (*pSVar2->_vptr_Symbol[2])(pSVar2,local_88);
  this_01._M_payload.super__Optional_payload_base<TypeName> =
       (_Optional_payload<TypeName,_true,_true,_true>)
       FunctionAnalyser::getReturnType((FunctionAnalyser *)local_88);
  ((_Optional_base<TypeName,_true,_true> *)(in_RDI + 8))->_M_payload =
       this_01._M_payload.super__Optional_payload_base<TypeName>;
  FunctionAnalyser::~FunctionAnalyser
            ((FunctionAnalyser *)this_01._M_payload.super__Optional_payload_base<TypeName>);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void TypeChecker::visit(const FunctionCallNode& node)
{
  auto name = node.getName();
  auto& symbol = symbols_.lookup(name).value().get();
  FunctionAnalyser analyser{};
  symbol.accept(analyser);
  type_ = analyser.getReturnType();
}